

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ml_sse3.c
# Opt level: O0

void av1_nn_fast_softmax_16_sse3(float *input,float *output)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 *in_RSI;
  undefined1 (*in_RDI) [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar17;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined1 auVar24 [16];
  __m128 afVar25;
  __m128 afVar26;
  __m128 afVar27;
  __m128 afVar28;
  __m128 sum;
  __m128 max_1;
  __m128 max_0;
  __m128 in_3;
  __m128 in_2;
  __m128 in_1;
  __m128 in_0;
  __m128 clipper;
  undefined8 local_398;
  undefined8 local_388;
  undefined8 local_378;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  float local_2e8;
  float fStack_2e4;
  float local_2c8;
  float fStack_2c4;
  float local_2a8;
  float fStack_2a4;
  float local_298;
  float fStack_294;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  __m128 y;
  __m128 reg;
  undefined8 uVar18;
  
  uVar17 = *(undefined8 *)*in_RDI;
  uVar18 = *(undefined8 *)(*in_RDI + 8);
  uVar1 = *(undefined8 *)in_RDI[1];
  uVar2 = *(undefined8 *)(in_RDI[1] + 8);
  uVar3 = *(undefined8 *)in_RDI[2];
  uVar4 = *(undefined8 *)(in_RDI[2] + 8);
  uVar5 = *(undefined8 *)in_RDI[3];
  uVar6 = *(undefined8 *)(in_RDI[3] + 8);
  auVar19 = maxps(*in_RDI,in_RDI[1]);
  auVar20 = maxps(in_RDI[2],in_RDI[3]);
  local_388 = auVar20._0_8_;
  auVar19 = maxps(auVar19,auVar20);
  local_378 = auVar19._0_8_;
  afVar25[2] = (float)(undefined4)local_388;
  afVar25[3] = (float)local_388._4_4_;
  afVar25[0] = (float)(undefined4)local_378;
  afVar25[1] = (float)local_378._4_4_;
  afVar25 = reduce_max(afVar25);
  local_98 = (float)uVar17;
  fStack_94 = (float)((ulong)uVar17 >> 0x20);
  fStack_90 = (float)uVar18;
  fStack_8c = (float)((ulong)uVar18 >> 0x20);
  local_a8 = afVar25[0];
  fStack_a4 = afVar25[1];
  fStack_a0 = (float)extraout_XMM0_Qb;
  fStack_9c = (float)((ulong)extraout_XMM0_Qb >> 0x20);
  local_338 = CONCAT44(fStack_94 - fStack_a4,local_98 - local_a8);
  uStack_330._0_4_ = fStack_90 - fStack_a0;
  uStack_330._4_4_ = fStack_8c - fStack_9c;
  local_b8 = (float)uVar1;
  fStack_b4 = (float)((ulong)uVar1 >> 0x20);
  fStack_b0 = (float)uVar2;
  fStack_ac = (float)((ulong)uVar2 >> 0x20);
  local_348 = CONCAT44(fStack_b4 - fStack_a4,local_b8 - local_a8);
  uStack_340._0_4_ = fStack_b0 - fStack_a0;
  uStack_340._4_4_ = fStack_ac - fStack_9c;
  local_d8 = (float)uVar3;
  fStack_d4 = (float)((ulong)uVar3 >> 0x20);
  fStack_d0 = (float)uVar4;
  fStack_cc = (float)((ulong)uVar4 >> 0x20);
  local_358 = CONCAT44(fStack_d4 - fStack_a4,local_d8 - local_a8);
  uStack_350._0_4_ = fStack_d0 - fStack_a0;
  uStack_350._4_4_ = fStack_cc - fStack_9c;
  local_f8 = (float)uVar5;
  fStack_f4 = (float)((ulong)uVar5 >> 0x20);
  fStack_f0 = (float)uVar6;
  fStack_ec = (float)((ulong)uVar6 >> 0x20);
  local_368 = CONCAT44(fStack_f4 - fStack_a4,local_f8 - local_a8);
  uStack_360._0_4_ = fStack_f0 - fStack_a0;
  uStack_360._4_4_ = fStack_ec - fStack_9c;
  auVar8._8_8_ = uStack_330;
  auVar8._0_8_ = local_338;
  auVar21._8_8_ = 0xc1200000c1200000;
  auVar21._0_8_ = 0xc1200000c1200000;
  auVar21 = maxps(auVar8,auVar21);
  auVar7._8_8_ = uStack_340;
  auVar7._0_8_ = local_348;
  auVar22._8_8_ = 0xc1200000c1200000;
  auVar22._0_8_ = 0xc1200000c1200000;
  auVar22 = maxps(auVar7,auVar22);
  auVar24._8_8_ = uStack_350;
  auVar24._0_8_ = local_358;
  auVar23._8_8_ = 0xc1200000c1200000;
  auVar23._0_8_ = 0xc1200000c1200000;
  auVar23 = maxps(auVar24,auVar23);
  auVar20._8_8_ = uStack_360;
  auVar20._0_8_ = local_368;
  auVar19._8_8_ = 0xc1200000c1200000;
  auVar19._0_8_ = 0xc1200000c1200000;
  auVar19 = maxps(auVar20,auVar19);
  local_338 = auVar21._0_8_;
  afVar26[2] = -10.0;
  afVar26[3] = -10.0;
  afVar26[0] = (float)(undefined4)local_338;
  afVar26[1] = (float)local_338._4_4_;
  afVar25 = approx_exp(afVar26);
  uVar17 = afVar25._0_8_;
  local_348 = auVar22._0_8_;
  afVar27[2] = (float)(int)afVar25._8_8_;
  afVar27[3] = (float)(int)((ulong)afVar25._8_8_ >> 0x20);
  afVar27[0] = (float)(undefined4)local_348;
  afVar27[1] = (float)local_348._4_4_;
  afVar26 = approx_exp(afVar27);
  local_298 = afVar25[0];
  fStack_294 = afVar25[1];
  local_2a8 = afVar26[0];
  fStack_2a4 = afVar26[1];
  local_358 = auVar23._0_8_;
  afVar28[2] = (float)(int)uVar17;
  afVar28[3] = (float)(int)((ulong)uVar17 >> 0x20);
  afVar28[0] = (float)(undefined4)local_358;
  afVar28[1] = (float)local_358._4_4_;
  afVar25 = approx_exp(afVar28);
  local_2c8 = afVar25[0];
  fStack_2c4 = afVar25[1];
  local_2c8 = local_298 + local_2a8 + local_2c8;
  fStack_2c4 = fStack_294 + fStack_2a4 + fStack_2c4;
  local_368 = auVar19._0_8_;
  y[2] = local_298 + local_2a8;
  y[3] = fStack_294 + fStack_2a4;
  y[0] = (float)(undefined4)local_368;
  y[1] = (float)local_368._4_4_;
  afVar27 = approx_exp(y);
  local_2e8 = afVar27[0];
  fStack_2e4 = afVar27[1];
  reg[2] = local_2c8;
  reg[3] = fStack_2c4;
  reg[0] = local_2c8 + local_2e8;
  reg[1] = fStack_2c4 + fStack_2e4;
  afVar28 = reduce_sum(reg);
  uVar18 = afVar28._0_8_;
  auVar16._8_8_ = extraout_XMM0_Qb_00;
  auVar16._0_8_ = uVar17;
  auVar15._8_8_ = extraout_XMM0_Qb_04;
  auVar15._0_8_ = uVar18;
  auVar19 = divps(auVar16,auVar15);
  auVar14._8_8_ = extraout_XMM0_Qb_01;
  auVar14._0_8_ = afVar26._0_8_;
  auVar13._8_8_ = extraout_XMM0_Qb_04;
  auVar13._0_8_ = uVar18;
  auVar20 = divps(auVar14,auVar13);
  auVar12._8_8_ = extraout_XMM0_Qb_02;
  auVar12._0_8_ = afVar25._0_8_;
  auVar11._8_8_ = extraout_XMM0_Qb_04;
  auVar11._0_8_ = uVar18;
  auVar23 = divps(auVar12,auVar11);
  auVar10._8_8_ = extraout_XMM0_Qb_03;
  auVar10._0_8_ = afVar27._0_8_;
  auVar9._8_8_ = extraout_XMM0_Qb_04;
  auVar9._0_8_ = uVar18;
  auVar24 = divps(auVar10,auVar9);
  local_338 = auVar19._0_8_;
  uStack_330 = auVar19._8_8_;
  *in_RSI = local_338;
  in_RSI[1] = uStack_330;
  local_348 = auVar20._0_8_;
  uStack_340 = auVar20._8_8_;
  in_RSI[2] = local_348;
  in_RSI[3] = uStack_340;
  local_358 = auVar23._0_8_;
  uStack_350 = auVar23._8_8_;
  in_RSI[4] = local_358;
  in_RSI[5] = uStack_350;
  local_368 = auVar24._0_8_;
  uStack_360 = auVar24._8_8_;
  in_RSI[6] = local_368;
  in_RSI[7] = uStack_360;
  return;
}

Assistant:

void av1_nn_fast_softmax_16_sse3(const float *input, float *output) {
  // Clips at -10 to avoid underflowing
  const __m128 clipper = _mm_set1_ps(-10.0f);

  // Load in 16 values
  __m128 in_0 = _mm_loadu_ps(&input[0]);
  __m128 in_1 = _mm_loadu_ps(&input[4]);
  __m128 in_2 = _mm_loadu_ps(&input[8]);
  __m128 in_3 = _mm_loadu_ps(&input[12]);

  // Get the max
  __m128 max_0 = _mm_max_ps(in_0, in_1);
  __m128 max_1 = _mm_max_ps(in_2, in_3);

  max_0 = _mm_max_ps(max_0, max_1);
  max_0 = reduce_max(max_0);

  // Subtract the max off and clip
  in_0 = _mm_sub_ps(in_0, max_0);
  in_1 = _mm_sub_ps(in_1, max_0);
  in_2 = _mm_sub_ps(in_2, max_0);
  in_3 = _mm_sub_ps(in_3, max_0);

  in_0 = _mm_max_ps(in_0, clipper);
  in_1 = _mm_max_ps(in_1, clipper);
  in_2 = _mm_max_ps(in_2, clipper);
  in_3 = _mm_max_ps(in_3, clipper);

  // Exponentiate and compute the denominator
  __m128 sum = in_0 = approx_exp(in_0);
  in_1 = approx_exp(in_1);
  sum = _mm_add_ps(sum, in_1);
  in_2 = approx_exp(in_2);
  sum = _mm_add_ps(sum, in_2);
  in_3 = approx_exp(in_3);
  sum = _mm_add_ps(sum, in_3);
  sum = reduce_sum(sum);

  // Divide to get the probability
  in_0 = _mm_div_ps(in_0, sum);
  in_1 = _mm_div_ps(in_1, sum);
  in_2 = _mm_div_ps(in_2, sum);
  in_3 = _mm_div_ps(in_3, sum);

  _mm_storeu_ps(&output[0], in_0);
  _mm_storeu_ps(&output[4], in_1);
  _mm_storeu_ps(&output[8], in_2);
  _mm_storeu_ps(&output[12], in_3);
}